

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     OperateHelperUnary<(unsigned_short)2,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,size_t param_2)

{
  size_t sVar1;
  undefined8 local_28;
  size_t j;
  int *data_local;
  View<int,_false,_std::allocator<unsigned_long>_> *v_local;
  
  local_28 = 0;
  j = param_2;
  while( true ) {
    sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
    if (sVar1 <= local_28) break;
    OperateHelperUnary<(unsigned_short)1,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
    ::operate(v,j);
    sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
    j = sVar1 * 4 + j;
    local_28 = local_28 + 1;
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
  return;
}

Assistant:

static inline void operate
    (
        View<T, false, A>& v, 
        Functor f, 
        T* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperUnary<N-1, Functor, T, A>::operate(v, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }